

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<4,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  RTCRayQueryContext *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 (*pauVar35) [16];
  undefined4 uVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  ulong *puVar40;
  long lVar41;
  undefined4 uVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  Scene *pSVar47;
  ulong unaff_R13;
  size_t mask;
  ulong uVar48;
  ulong uVar49;
  vint4 bi_1;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  vint4 ai_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar68;
  float fVar79;
  float fVar80;
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar73 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar81;
  undefined1 auVar78 [32];
  vint4 bi;
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar99;
  float fVar104;
  float fVar105;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  vint4 ai;
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar124;
  undefined1 auVar125 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar126 [64];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar137 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1504;
  ulong local_1500;
  Scene *local_14f8;
  RTCFilterFunctionNArguments local_14f0;
  undefined1 local_14c0 [32];
  undefined1 (*local_1498) [16];
  long local_1490;
  ulong local_1488;
  ulong local_1480;
  ulong local_1478;
  float local_1470;
  float local_146c;
  float local_1468;
  undefined4 local_1464;
  undefined4 local_1460;
  undefined4 local_145c;
  uint local_1458;
  uint local_1454;
  uint local_1450;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [16];
  undefined4 uStack_1310;
  undefined4 uStack_130c;
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  undefined4 uStack_11c4;
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar65;
  float fVar66;
  float fVar67;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      auVar55 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar57 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar94._8_4_ = 0x7fffffff;
      auVar94._0_8_ = 0x7fffffff7fffffff;
      auVar94._12_4_ = 0x7fffffff;
      auVar94 = vandps_avx((undefined1  [16])aVar2,auVar94);
      auVar88._8_4_ = 0x219392ef;
      auVar88._0_8_ = 0x219392ef219392ef;
      auVar88._12_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar94,auVar88,1);
      auVar94 = vblendvps_avx((undefined1  [16])aVar2,auVar88,auVar94);
      local_1498 = (undefined1 (*) [16])local_f90;
      auVar88 = vrcpps_avx(auVar94);
      auVar89._8_4_ = 0x3f800000;
      auVar89._0_8_ = &DAT_3f8000003f800000;
      auVar89._12_4_ = 0x3f800000;
      auVar94 = vfnmadd231ps_fma(auVar89,auVar88,auVar94);
      auVar89 = vfmadd132ps_fma(auVar94,auVar88,auVar88);
      fVar87 = auVar89._0_4_;
      local_1350._4_4_ = fVar87;
      local_1350._0_4_ = fVar87;
      local_1350._8_4_ = fVar87;
      local_1350._12_4_ = fVar87;
      auVar123 = ZEXT1664(local_1350);
      auVar94 = vmovshdup_avx(auVar89);
      local_1360 = vshufps_avx(auVar89,auVar89,0x55);
      auVar126 = ZEXT1664(local_1360);
      auVar88 = vshufpd_avx(auVar89,auVar89,1);
      local_1370 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar135 = ZEXT1664(local_1370);
      auVar90._0_4_ = fVar87 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar90._4_4_ = auVar89._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
      auVar90._8_4_ = auVar89._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
      auVar90._12_4_ = auVar89._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
      auVar89 = vshufps_avx(auVar90,auVar90,0x55);
      auVar56 = vshufps_avx(auVar90,auVar90,0xaa);
      uVar36 = auVar57._0_4_;
      auVar54 = ZEXT1664(CONCAT412(uVar36,CONCAT48(uVar36,CONCAT44(uVar36,uVar36))));
      uVar46 = (ulong)(fVar87 < 0.0) * 4;
      uVar45 = (ulong)((uint)(auVar94._0_4_ < 0.0) * 4 + 8);
      local_1478 = uVar45 ^ 4;
      local_1480 = (ulong)((uint)(auVar88._0_4_ < 0.0) * 4 + 0x10);
      local_1488 = local_1480 ^ 4;
      uVar49 = CONCAT44(auVar90._0_4_,auVar90._0_4_);
      local_1380._0_8_ = uVar49 ^ 0x8000000080000000;
      local_1380._8_4_ = -auVar90._0_4_;
      local_1380._12_4_ = -auVar90._0_4_;
      auVar137 = ZEXT1664(local_1380);
      local_1390._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
      local_1390._8_4_ = auVar89._8_4_ ^ 0x80000000;
      local_1390._12_4_ = auVar89._12_4_ ^ 0x80000000;
      auVar146 = ZEXT1664(local_1390);
      local_13a0._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
      local_13a0._8_4_ = auVar56._8_4_ ^ 0x80000000;
      local_13a0._12_4_ = auVar56._12_4_ ^ 0x80000000;
      auVar147 = ZEXT1664(local_13a0);
      uVar36 = auVar55._0_4_;
      local_13b0._4_4_ = uVar36;
      local_13b0._0_4_ = uVar36;
      local_13b0._8_4_ = uVar36;
      local_13b0._12_4_ = uVar36;
      auVar149 = ZEXT1664(local_13b0);
      local_1140._16_16_ = mm_lookupmask_ps._240_16_;
      local_1140._0_16_ = mm_lookupmask_ps._0_16_;
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = &DAT_3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      auVar73._16_4_ = 0x3f800000;
      auVar73._20_4_ = 0x3f800000;
      auVar73._24_4_ = 0x3f800000;
      auVar73._28_4_ = 0x3f800000;
      auVar52._8_4_ = 0xbf800000;
      auVar52._0_8_ = 0xbf800000bf800000;
      auVar52._12_4_ = 0xbf800000;
      auVar52._16_4_ = 0xbf800000;
      auVar52._20_4_ = 0xbf800000;
      auVar52._24_4_ = 0xbf800000;
      auVar52._28_4_ = 0xbf800000;
      local_1160 = vblendvps_avx(auVar73,auVar52,local_1140);
      do {
        do {
          do {
            if (local_1498 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar35 = local_1498 + -1;
            local_1498 = local_1498 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar35 + 8));
          uVar49 = *(ulong *)*local_1498;
          do {
            if ((uVar49 & 8) == 0) {
              puVar40 = (ulong *)((uVar49 & 0xfffffffffffffff0) + 0x20);
              if ((uVar49 & 0xfffffffffffffff0) == 0) {
                puVar40 = (ulong *)0x0;
              }
              uVar36 = (undefined4)puVar40[3];
              auVar69._4_4_ = uVar36;
              auVar69._0_4_ = uVar36;
              auVar69._8_4_ = uVar36;
              auVar69._12_4_ = uVar36;
              uVar36 = *(undefined4 *)((long)puVar40 + 0x24);
              auVar82._4_4_ = uVar36;
              auVar82._0_4_ = uVar36;
              auVar82._8_4_ = uVar36;
              auVar82._12_4_ = uVar36;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = *(ulong *)((long)puVar40 + uVar46);
              auVar94 = vpmovzxbd_avx(auVar55);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar57 = vfmadd213ps_fma(auVar94,auVar82,auVar69);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = *(ulong *)((long)puVar40 + (uVar46 ^ 4));
              auVar94 = vpmovzxbd_avx(auVar56);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar88 = vfmadd213ps_fma(auVar94,auVar82,auVar69);
              uVar36 = *(undefined4 *)((long)puVar40 + 0x1c);
              auVar91._4_4_ = uVar36;
              auVar91._0_4_ = uVar36;
              auVar91._8_4_ = uVar36;
              auVar91._12_4_ = uVar36;
              uVar36 = (undefined4)puVar40[5];
              auVar100._4_4_ = uVar36;
              auVar100._0_4_ = uVar36;
              auVar100._8_4_ = uVar36;
              auVar100._12_4_ = uVar36;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = *(ulong *)((long)puVar40 + uVar45);
              auVar94 = vpmovzxbd_avx(auVar70);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar89 = vfmadd213ps_fma(auVar94,auVar100,auVar91);
              auVar71._8_8_ = 0;
              auVar71._0_8_ = *(ulong *)((long)puVar40 + local_1478);
              auVar94 = vpmovzxbd_avx(auVar71);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar56 = vfmadd213ps_fma(auVar94,auVar100,auVar91);
              uVar36 = (undefined4)puVar40[4];
              auVar92._4_4_ = uVar36;
              auVar92._0_4_ = uVar36;
              auVar92._8_4_ = uVar36;
              auVar92._12_4_ = uVar36;
              uVar36 = *(undefined4 *)((long)puVar40 + 0x2c);
              auVar101._4_4_ = uVar36;
              auVar101._0_4_ = uVar36;
              auVar101._8_4_ = uVar36;
              auVar101._12_4_ = uVar36;
              auVar110._8_8_ = 0;
              auVar110._0_8_ = *(ulong *)((long)puVar40 + local_1480);
              auVar94 = vpmovzxbd_avx(auVar110);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar90 = vfmadd213ps_fma(auVar94,auVar101,auVar92);
              auVar112._8_8_ = 0;
              auVar112._0_8_ = *(ulong *)((long)puVar40 + local_1488);
              auVar94 = vpmovzxbd_avx(auVar112);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar69 = vfmadd213ps_fma(auVar94,auVar101,auVar92);
              auVar93._8_8_ = 0;
              auVar93._0_8_ = *puVar40;
              auVar102._8_8_ = 0;
              auVar102._0_8_ = *(ulong *)((long)puVar40 + 4);
              auVar55 = vpminub_avx(auVar93,auVar102);
              auVar94 = vpcmpeqb_avx(auVar93,auVar55);
              auVar55 = vpcmpeqd_avx(auVar55,auVar55);
              auVar94 = vpmovzxbd_avx(auVar94 ^ auVar55);
              auVar94 = vpslld_avx(auVar94 ^ auVar55,0x1f);
              uVar36 = vmovmskps_avx(auVar94);
              auVar94 = vfmadd213ps_fma(auVar57,auVar123._0_16_,auVar137._0_16_);
              auVar55 = vfmadd213ps_fma(auVar89,auVar126._0_16_,auVar146._0_16_);
              auVar94 = vpmaxsd_avx(auVar94,auVar55);
              auVar55 = vfmadd213ps_fma(auVar90,auVar135._0_16_,auVar147._0_16_);
              auVar55 = vpmaxsd_avx(auVar55,auVar149._0_16_);
              local_1320 = vpmaxsd_avx(auVar94,auVar55);
              auVar94 = vfmadd213ps_fma(auVar88,auVar123._0_16_,auVar137._0_16_);
              auVar55 = vfmadd213ps_fma(auVar56,auVar126._0_16_,auVar146._0_16_);
              auVar94 = vpminsd_avx(auVar94,auVar55);
              auVar55 = vfmadd213ps_fma(auVar69,auVar135._0_16_,auVar147._0_16_);
              auVar55 = vpminsd_avx(auVar55,auVar54._0_16_);
              auVar94 = vpminsd_avx(auVar94,auVar55);
              auVar94 = vpcmpgtd_avx(local_1320,auVar94);
              uVar42 = vmovmskps_avx(auVar94);
              unaff_R13 = (ulong)(byte)(~(byte)uVar42 & (byte)uVar36);
            }
            if ((uVar49 & 8) == 0) {
              if (unaff_R13 == 0) {
                iVar37 = 4;
              }
              else {
                uVar48 = uVar49 & 0xfffffffffffffff0;
                lVar44 = 0;
                for (uVar49 = unaff_R13; (uVar49 & 1) == 0;
                    uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                  lVar44 = lVar44 + 1;
                }
                iVar37 = 0;
                uVar43 = unaff_R13 - 1 & unaff_R13;
                uVar49 = *(ulong *)(uVar48 + lVar44 * 8);
                if (uVar43 != 0) {
                  uVar39 = *(uint *)(local_1320 + lVar44 * 4);
                  lVar44 = 0;
                  for (uVar20 = uVar43; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000
                      ) {
                    lVar44 = lVar44 + 1;
                  }
                  uVar43 = uVar43 - 1 & uVar43;
                  uVar20 = *(ulong *)(uVar48 + lVar44 * 8);
                  uVar38 = *(uint *)(local_1320 + lVar44 * 4);
                  if (uVar43 == 0) {
                    if (uVar39 < uVar38) {
                      *(ulong *)*local_1498 = uVar20;
                      *(uint *)(*local_1498 + 8) = uVar38;
                      local_1498 = local_1498 + 1;
                    }
                    else {
                      *(ulong *)*local_1498 = uVar49;
                      *(uint *)(*local_1498 + 8) = uVar39;
                      local_1498 = local_1498 + 1;
                      uVar49 = uVar20;
                    }
                  }
                  else {
                    auVar57._8_8_ = 0;
                    auVar57._0_8_ = uVar49;
                    auVar94 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar39));
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = uVar20;
                    auVar55 = vpunpcklqdq_avx(auVar60,ZEXT416(uVar38));
                    lVar44 = 0;
                    for (uVar49 = uVar43; (uVar49 & 1) == 0;
                        uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                      lVar44 = lVar44 + 1;
                    }
                    uVar43 = uVar43 - 1 & uVar43;
                    auVar72._8_8_ = 0;
                    auVar72._0_8_ = *(ulong *)(uVar48 + lVar44 * 8);
                    auVar88 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_1320 + lVar44 * 4)));
                    auVar57 = vpcmpgtd_avx(auVar55,auVar94);
                    if (uVar43 == 0) {
                      auVar89 = vpshufd_avx(auVar57,0xaa);
                      auVar57 = vblendvps_avx(auVar55,auVar94,auVar89);
                      auVar94 = vblendvps_avx(auVar94,auVar55,auVar89);
                      auVar55 = vpcmpgtd_avx(auVar88,auVar57);
                      auVar89 = vpshufd_avx(auVar55,0xaa);
                      auVar55 = vblendvps_avx(auVar88,auVar57,auVar89);
                      auVar57 = vblendvps_avx(auVar57,auVar88,auVar89);
                      auVar88 = vpcmpgtd_avx(auVar57,auVar94);
                      auVar89 = vpshufd_avx(auVar88,0xaa);
                      auVar88 = vblendvps_avx(auVar57,auVar94,auVar89);
                      auVar94 = vblendvps_avx(auVar94,auVar57,auVar89);
                      *local_1498 = auVar94;
                      local_1498[1] = auVar88;
                      uVar49 = auVar55._0_8_;
                      local_1498 = local_1498 + 2;
                    }
                    else {
                      lVar44 = 0;
                      for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                        lVar44 = lVar44 + 1;
                      }
                      auVar95._8_8_ = 0;
                      auVar95._0_8_ = *(ulong *)(uVar48 + lVar44 * 8);
                      auVar56 = vpunpcklqdq_avx(auVar95,ZEXT416(*(uint *)(local_1320 + lVar44 * 4)))
                      ;
                      auVar89 = vpshufd_avx(auVar57,0xaa);
                      auVar57 = vblendvps_avx(auVar55,auVar94,auVar89);
                      auVar94 = vblendvps_avx(auVar94,auVar55,auVar89);
                      auVar55 = vpcmpgtd_avx(auVar56,auVar88);
                      auVar89 = vpshufd_avx(auVar55,0xaa);
                      auVar55 = vblendvps_avx(auVar56,auVar88,auVar89);
                      auVar88 = vblendvps_avx(auVar88,auVar56,auVar89);
                      auVar89 = vpcmpgtd_avx(auVar88,auVar94);
                      auVar56 = vpshufd_avx(auVar89,0xaa);
                      auVar89 = vblendvps_avx(auVar88,auVar94,auVar56);
                      auVar94 = vblendvps_avx(auVar94,auVar88,auVar56);
                      auVar88 = vpcmpgtd_avx(auVar55,auVar57);
                      auVar56 = vpshufd_avx(auVar88,0xaa);
                      auVar88 = vblendvps_avx(auVar55,auVar57,auVar56);
                      auVar55 = vblendvps_avx(auVar57,auVar55,auVar56);
                      auVar57 = vpcmpgtd_avx(auVar89,auVar55);
                      auVar56 = vpshufd_avx(auVar57,0xaa);
                      auVar57 = vblendvps_avx(auVar89,auVar55,auVar56);
                      auVar55 = vblendvps_avx(auVar55,auVar89,auVar56);
                      *local_1498 = auVar94;
                      local_1498[1] = auVar55;
                      local_1498[2] = auVar57;
                      uVar49 = auVar88._0_8_;
                      local_1498 = local_1498 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar37 = 6;
            }
          } while (iVar37 == 0);
        } while (iVar37 != 6);
        local_1490 = (ulong)((uint)uVar49 & 0xf) - 8;
        if (local_1490 != 0) {
          uVar49 = uVar49 & 0xfffffffffffffff0;
          lVar44 = 0;
          local_1500 = unaff_R13;
          do {
            lVar41 = lVar44 * 0x60;
            pSVar47 = context->scene;
            ppfVar3 = (pSVar47->vertices).items;
            pfVar4 = ppfVar3[*(uint *)(uVar49 + 0x40 + lVar41)];
            auVar61._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar49 + 0x20 + lVar41));
            auVar61._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar49 + lVar41));
            pfVar5 = ppfVar3[*(uint *)(uVar49 + 0x48 + lVar41)];
            auVar74._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar49 + 0x28 + lVar41));
            auVar74._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar49 + 8 + lVar41));
            pfVar6 = ppfVar3[*(uint *)(uVar49 + 0x44 + lVar41)];
            auVar96._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar49 + 0x24 + lVar41));
            auVar96._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar49 + 4 + lVar41));
            pfVar7 = ppfVar3[*(uint *)(uVar49 + 0x4c + lVar41)];
            auVar118._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar49 + 0x2c + lVar41));
            auVar118._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar49 + 0xc + lVar41));
            lVar1 = uVar49 + 0x40 + lVar41;
            local_fc0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            lVar1 = uVar49 + 0x50 + lVar41;
            local_1340 = *(undefined8 *)(lVar1 + 0x10);
            uStack_1338 = *(undefined8 *)(lVar1 + 0x18);
            auVar57 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar49 + 0x10 + lVar41)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar49 + 0x18 + lVar41)));
            auVar94 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar49 + 0x10 + lVar41)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar49 + 0x18 + lVar41)));
            auVar88 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar49 + 0x14 + lVar41)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar49 + 0x1c + lVar41)));
            auVar55 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar49 + 0x14 + lVar41)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar49 + 0x1c + lVar41)));
            auVar89 = vunpcklps_avx(auVar94,auVar55);
            auVar56 = vunpcklps_avx(auVar57,auVar88);
            auVar94 = vunpckhps_avx(auVar57,auVar88);
            auVar88 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar49 + 0x30 + lVar41)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar49 + 0x38 + lVar41)));
            auVar55 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar49 + 0x30 + lVar41)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar49 + 0x38 + lVar41)));
            auVar90 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar49 + 0x34 + lVar41)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar49 + 0x3c + lVar41)));
            auVar57 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar49 + 0x34 + lVar41)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar49 + 0x3c + lVar41)));
            auVar57 = vunpcklps_avx(auVar55,auVar57);
            auVar69 = vunpcklps_avx(auVar88,auVar90);
            auVar55 = vunpckhps_avx(auVar88,auVar90);
            uStack_1330 = local_1340;
            uStack_1328 = uStack_1338;
            auVar52 = vunpcklps_avx(auVar96,auVar118);
            auVar73 = vunpcklps_avx(auVar61,auVar74);
            auVar19 = vunpcklps_avx(auVar73,auVar52);
            auVar52 = vunpckhps_avx(auVar73,auVar52);
            auVar73 = vunpckhps_avx(auVar96,auVar118);
            auVar64 = vunpckhps_avx(auVar61,auVar74);
            auVar73 = vunpcklps_avx(auVar64,auVar73);
            auVar75._16_16_ = auVar56;
            auVar75._0_16_ = auVar56;
            auVar97._16_16_ = auVar94;
            auVar97._0_16_ = auVar94;
            auVar111._16_16_ = auVar89;
            auVar111._0_16_ = auVar89;
            auVar148._16_16_ = auVar69;
            auVar148._0_16_ = auVar69;
            auVar83._16_16_ = auVar55;
            auVar83._0_16_ = auVar55;
            uVar36 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar113._4_4_ = uVar36;
            auVar113._0_4_ = uVar36;
            auVar113._8_4_ = uVar36;
            auVar113._12_4_ = uVar36;
            auVar113._16_4_ = uVar36;
            auVar113._20_4_ = uVar36;
            auVar113._24_4_ = uVar36;
            auVar113._28_4_ = uVar36;
            uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar119._4_4_ = uVar36;
            auVar119._0_4_ = uVar36;
            auVar119._8_4_ = uVar36;
            auVar119._12_4_ = uVar36;
            auVar119._16_4_ = uVar36;
            auVar119._20_4_ = uVar36;
            auVar119._24_4_ = uVar36;
            auVar119._28_4_ = uVar36;
            auVar50._16_16_ = auVar57;
            auVar50._0_16_ = auVar57;
            uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar145._4_4_ = uVar36;
            auVar145._0_4_ = uVar36;
            auVar145._8_4_ = uVar36;
            auVar145._12_4_ = uVar36;
            auVar145._16_4_ = uVar36;
            auVar145._20_4_ = uVar36;
            auVar145._24_4_ = uVar36;
            auVar145._28_4_ = uVar36;
            local_13e0 = vsubps_avx(auVar19,auVar113);
            local_fe0 = vsubps_avx(auVar52,auVar119);
            local_1000 = vsubps_avx(auVar73,auVar145);
            auVar52 = vsubps_avx(auVar75,auVar113);
            auVar73 = vsubps_avx(auVar97,auVar119);
            auVar64 = vsubps_avx(auVar111,auVar145);
            auVar19 = vsubps_avx(auVar148,auVar113);
            auVar61 = vsubps_avx(auVar83,auVar119);
            auVar17 = vsubps_avx(auVar50,auVar145);
            local_1040 = vsubps_avx(auVar19,local_13e0);
            local_1400 = vsubps_avx(auVar61,local_fe0);
            local_1020 = vsubps_avx(auVar17,local_1000);
            auVar51._0_4_ = auVar19._0_4_ + local_13e0._0_4_;
            auVar51._4_4_ = auVar19._4_4_ + local_13e0._4_4_;
            auVar51._8_4_ = auVar19._8_4_ + local_13e0._8_4_;
            auVar51._12_4_ = auVar19._12_4_ + local_13e0._12_4_;
            auVar51._16_4_ = auVar19._16_4_ + local_13e0._16_4_;
            auVar51._20_4_ = auVar19._20_4_ + local_13e0._20_4_;
            auVar51._24_4_ = auVar19._24_4_ + local_13e0._24_4_;
            auVar51._28_4_ = auVar19._28_4_ + local_13e0._28_4_;
            auVar76._0_4_ = local_fe0._0_4_ + auVar61._0_4_;
            auVar76._4_4_ = local_fe0._4_4_ + auVar61._4_4_;
            auVar76._8_4_ = local_fe0._8_4_ + auVar61._8_4_;
            auVar76._12_4_ = local_fe0._12_4_ + auVar61._12_4_;
            auVar76._16_4_ = local_fe0._16_4_ + auVar61._16_4_;
            auVar76._20_4_ = local_fe0._20_4_ + auVar61._20_4_;
            auVar76._24_4_ = local_fe0._24_4_ + auVar61._24_4_;
            auVar76._28_4_ = local_fe0._28_4_ + auVar61._28_4_;
            fVar87 = local_1000._0_4_;
            auVar84._0_4_ = auVar17._0_4_ + fVar87;
            fVar11 = local_1000._4_4_;
            auVar84._4_4_ = auVar17._4_4_ + fVar11;
            fVar12 = local_1000._8_4_;
            auVar84._8_4_ = auVar17._8_4_ + fVar12;
            fVar13 = local_1000._12_4_;
            auVar84._12_4_ = auVar17._12_4_ + fVar13;
            fVar14 = local_1000._16_4_;
            auVar84._16_4_ = auVar17._16_4_ + fVar14;
            fVar15 = local_1000._20_4_;
            auVar84._20_4_ = auVar17._20_4_ + fVar15;
            fVar16 = local_1000._24_4_;
            auVar84._24_4_ = auVar17._24_4_ + fVar16;
            fVar99 = local_1000._28_4_;
            auVar84._28_4_ = auVar17._28_4_ + fVar99;
            auVar18._4_4_ = local_1020._4_4_ * auVar76._4_4_;
            auVar18._0_4_ = local_1020._0_4_ * auVar76._0_4_;
            auVar18._8_4_ = local_1020._8_4_ * auVar76._8_4_;
            auVar18._12_4_ = local_1020._12_4_ * auVar76._12_4_;
            auVar18._16_4_ = local_1020._16_4_ * auVar76._16_4_;
            auVar18._20_4_ = local_1020._20_4_ * auVar76._20_4_;
            auVar18._24_4_ = local_1020._24_4_ * auVar76._24_4_;
            auVar18._28_4_ = uVar36;
            auVar55 = vfmsub231ps_fma(auVar18,local_1400,auVar84);
            auVar21._4_4_ = local_1040._4_4_ * auVar84._4_4_;
            auVar21._0_4_ = local_1040._0_4_ * auVar84._0_4_;
            auVar21._8_4_ = local_1040._8_4_ * auVar84._8_4_;
            auVar21._12_4_ = local_1040._12_4_ * auVar84._12_4_;
            auVar21._16_4_ = local_1040._16_4_ * auVar84._16_4_;
            auVar21._20_4_ = local_1040._20_4_ * auVar84._20_4_;
            auVar21._24_4_ = local_1040._24_4_ * auVar84._24_4_;
            auVar21._28_4_ = auVar84._28_4_;
            auVar94 = vfmsub231ps_fma(auVar21,local_1020,auVar51);
            auVar22._4_4_ = local_1400._4_4_ * auVar51._4_4_;
            auVar22._0_4_ = local_1400._0_4_ * auVar51._0_4_;
            auVar22._8_4_ = local_1400._8_4_ * auVar51._8_4_;
            auVar22._12_4_ = local_1400._12_4_ * auVar51._12_4_;
            auVar22._16_4_ = local_1400._16_4_ * auVar51._16_4_;
            auVar22._20_4_ = local_1400._20_4_ * auVar51._20_4_;
            auVar22._24_4_ = local_1400._24_4_ * auVar51._24_4_;
            auVar22._28_4_ = auVar51._28_4_;
            auVar57 = vfmsub231ps_fma(auVar22,local_1040,auVar76);
            uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            local_14c0._4_4_ = uVar36;
            local_14c0._0_4_ = uVar36;
            local_14c0._8_4_ = uVar36;
            local_14c0._12_4_ = uVar36;
            local_14c0._16_4_ = uVar36;
            local_14c0._20_4_ = uVar36;
            local_14c0._24_4_ = uVar36;
            local_14c0._28_4_ = uVar36;
            local_1060 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar23._4_4_ = local_1060 * auVar57._4_4_;
            auVar23._0_4_ = local_1060 * auVar57._0_4_;
            auVar23._8_4_ = local_1060 * auVar57._8_4_;
            auVar23._12_4_ = local_1060 * auVar57._12_4_;
            auVar23._16_4_ = local_1060 * 0.0;
            auVar23._20_4_ = local_1060 * 0.0;
            auVar23._24_4_ = local_1060 * 0.0;
            auVar23._28_4_ = local_1040._28_4_;
            auVar94 = vfmadd231ps_fma(auVar23,local_14c0,ZEXT1632(auVar94));
            uVar36 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            local_1440._4_4_ = uVar36;
            local_1440._0_4_ = uVar36;
            local_1440._8_4_ = uVar36;
            local_1440._12_4_ = uVar36;
            local_1440._16_4_ = uVar36;
            local_1440._20_4_ = uVar36;
            local_1440._24_4_ = uVar36;
            local_1440._28_4_ = uVar36;
            local_1320 = vfmadd231ps_fma(ZEXT1632(auVar94),local_1440,ZEXT1632(auVar55));
            local_1080 = vsubps_avx(local_fe0,auVar73);
            local_10a0 = vsubps_avx(local_1000,auVar64);
            auVar77._0_4_ = local_fe0._0_4_ + auVar73._0_4_;
            auVar77._4_4_ = local_fe0._4_4_ + auVar73._4_4_;
            auVar77._8_4_ = local_fe0._8_4_ + auVar73._8_4_;
            auVar77._12_4_ = local_fe0._12_4_ + auVar73._12_4_;
            auVar77._16_4_ = local_fe0._16_4_ + auVar73._16_4_;
            auVar77._20_4_ = local_fe0._20_4_ + auVar73._20_4_;
            auVar77._24_4_ = local_fe0._24_4_ + auVar73._24_4_;
            auVar77._28_4_ = local_fe0._28_4_ + auVar73._28_4_;
            auVar85._0_4_ = auVar64._0_4_ + fVar87;
            auVar85._4_4_ = auVar64._4_4_ + fVar11;
            auVar85._8_4_ = auVar64._8_4_ + fVar12;
            auVar85._12_4_ = auVar64._12_4_ + fVar13;
            auVar85._16_4_ = auVar64._16_4_ + fVar14;
            auVar85._20_4_ = auVar64._20_4_ + fVar15;
            auVar85._24_4_ = auVar64._24_4_ + fVar16;
            fVar144 = auVar64._28_4_;
            auVar85._28_4_ = fVar144 + fVar99;
            fVar65 = local_10a0._0_4_;
            fVar66 = local_10a0._4_4_;
            auVar24._4_4_ = auVar77._4_4_ * fVar66;
            auVar24._0_4_ = auVar77._0_4_ * fVar65;
            fVar67 = local_10a0._8_4_;
            auVar24._8_4_ = auVar77._8_4_ * fVar67;
            fVar68 = local_10a0._12_4_;
            auVar24._12_4_ = auVar77._12_4_ * fVar68;
            fVar79 = local_10a0._16_4_;
            auVar24._16_4_ = auVar77._16_4_ * fVar79;
            fVar80 = local_10a0._20_4_;
            auVar24._20_4_ = auVar77._20_4_ * fVar80;
            fVar81 = local_10a0._24_4_;
            auVar24._24_4_ = auVar77._24_4_ * fVar81;
            auVar24._28_4_ = fVar99;
            auVar55 = vfmsub231ps_fma(auVar24,local_1080,auVar85);
            local_10c0 = vsubps_avx(local_13e0,auVar52);
            fVar136 = local_10c0._0_4_;
            fVar138 = local_10c0._4_4_;
            auVar25._4_4_ = fVar138 * auVar85._4_4_;
            auVar25._0_4_ = fVar136 * auVar85._0_4_;
            fVar139 = local_10c0._8_4_;
            auVar25._8_4_ = fVar139 * auVar85._8_4_;
            fVar140 = local_10c0._12_4_;
            auVar25._12_4_ = fVar140 * auVar85._12_4_;
            fVar141 = local_10c0._16_4_;
            auVar25._16_4_ = fVar141 * auVar85._16_4_;
            fVar142 = local_10c0._20_4_;
            auVar25._20_4_ = fVar142 * auVar85._20_4_;
            fVar143 = local_10c0._24_4_;
            auVar25._24_4_ = fVar143 * auVar85._24_4_;
            auVar25._28_4_ = local_1020._28_4_;
            auVar86._0_4_ = auVar52._0_4_ + local_13e0._0_4_;
            auVar86._4_4_ = auVar52._4_4_ + local_13e0._4_4_;
            auVar86._8_4_ = auVar52._8_4_ + local_13e0._8_4_;
            auVar86._12_4_ = auVar52._12_4_ + local_13e0._12_4_;
            auVar86._16_4_ = auVar52._16_4_ + local_13e0._16_4_;
            auVar86._20_4_ = auVar52._20_4_ + local_13e0._20_4_;
            auVar86._24_4_ = auVar52._24_4_ + local_13e0._24_4_;
            auVar86._28_4_ = auVar52._28_4_ + local_13e0._28_4_;
            auVar94 = vfmsub231ps_fma(auVar25,local_10a0,auVar86);
            fVar124 = local_1080._0_4_;
            fVar127 = local_1080._4_4_;
            auVar26._4_4_ = fVar127 * auVar86._4_4_;
            auVar26._0_4_ = fVar124 * auVar86._0_4_;
            fVar128 = local_1080._8_4_;
            auVar26._8_4_ = fVar128 * auVar86._8_4_;
            fVar129 = local_1080._12_4_;
            auVar26._12_4_ = fVar129 * auVar86._12_4_;
            fVar130 = local_1080._16_4_;
            auVar26._16_4_ = fVar130 * auVar86._16_4_;
            fVar131 = local_1080._20_4_;
            auVar26._20_4_ = fVar131 * auVar86._20_4_;
            fVar132 = local_1080._24_4_;
            auVar26._24_4_ = fVar132 * auVar86._24_4_;
            auVar26._28_4_ = auVar86._28_4_;
            auVar57 = vfmsub231ps_fma(auVar26,local_10c0,auVar77);
            auVar27._4_4_ = local_1060 * auVar57._4_4_;
            auVar27._0_4_ = local_1060 * auVar57._0_4_;
            auVar27._8_4_ = local_1060 * auVar57._8_4_;
            auVar27._12_4_ = local_1060 * auVar57._12_4_;
            auVar27._16_4_ = local_1060 * 0.0;
            auVar27._20_4_ = local_1060 * 0.0;
            auVar27._24_4_ = local_1060 * 0.0;
            auVar27._28_4_ = local_10a0._28_4_;
            auVar94 = vfmadd231ps_fma(auVar27,local_14c0,ZEXT1632(auVar94));
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_1440,ZEXT1632(auVar55));
            auVar18 = vsubps_avx(auVar52,auVar19);
            auVar62._0_4_ = auVar52._0_4_ + auVar19._0_4_;
            auVar62._4_4_ = auVar52._4_4_ + auVar19._4_4_;
            auVar62._8_4_ = auVar52._8_4_ + auVar19._8_4_;
            auVar62._12_4_ = auVar52._12_4_ + auVar19._12_4_;
            auVar62._16_4_ = auVar52._16_4_ + auVar19._16_4_;
            auVar62._20_4_ = auVar52._20_4_ + auVar19._20_4_;
            auVar62._24_4_ = auVar52._24_4_ + auVar19._24_4_;
            auVar62._28_4_ = auVar52._28_4_ + auVar19._28_4_;
            auVar19 = vsubps_avx(auVar73,auVar61);
            auVar98._0_4_ = auVar73._0_4_ + auVar61._0_4_;
            auVar98._4_4_ = auVar73._4_4_ + auVar61._4_4_;
            auVar98._8_4_ = auVar73._8_4_ + auVar61._8_4_;
            auVar98._12_4_ = auVar73._12_4_ + auVar61._12_4_;
            auVar98._16_4_ = auVar73._16_4_ + auVar61._16_4_;
            auVar98._20_4_ = auVar73._20_4_ + auVar61._20_4_;
            auVar98._24_4_ = auVar73._24_4_ + auVar61._24_4_;
            auVar98._28_4_ = auVar73._28_4_ + auVar61._28_4_;
            auVar61 = vsubps_avx(auVar64,auVar17);
            auVar58._0_4_ = auVar64._0_4_ + auVar17._0_4_;
            auVar58._4_4_ = auVar64._4_4_ + auVar17._4_4_;
            auVar58._8_4_ = auVar64._8_4_ + auVar17._8_4_;
            auVar58._12_4_ = auVar64._12_4_ + auVar17._12_4_;
            auVar58._16_4_ = auVar64._16_4_ + auVar17._16_4_;
            auVar58._20_4_ = auVar64._20_4_ + auVar17._20_4_;
            auVar58._24_4_ = auVar64._24_4_ + auVar17._24_4_;
            auVar58._28_4_ = fVar144 + auVar17._28_4_;
            auVar103._0_4_ = auVar61._0_4_ * auVar98._0_4_;
            auVar103._4_4_ = auVar61._4_4_ * auVar98._4_4_;
            auVar103._8_4_ = auVar61._8_4_ * auVar98._8_4_;
            auVar103._12_4_ = auVar61._12_4_ * auVar98._12_4_;
            auVar103._16_4_ = auVar61._16_4_ * auVar98._16_4_;
            auVar103._20_4_ = auVar61._20_4_ * auVar98._20_4_;
            auVar103._24_4_ = auVar61._24_4_ * auVar98._24_4_;
            auVar103._28_4_ = 0;
            auVar57 = vfmsub231ps_fma(auVar103,auVar19,auVar58);
            auVar64._4_4_ = auVar58._4_4_ * auVar18._4_4_;
            auVar64._0_4_ = auVar58._0_4_ * auVar18._0_4_;
            auVar64._8_4_ = auVar58._8_4_ * auVar18._8_4_;
            auVar64._12_4_ = auVar58._12_4_ * auVar18._12_4_;
            auVar64._16_4_ = auVar58._16_4_ * auVar18._16_4_;
            auVar64._20_4_ = auVar58._20_4_ * auVar18._20_4_;
            auVar64._24_4_ = auVar58._24_4_ * auVar18._24_4_;
            auVar64._28_4_ = auVar58._28_4_;
            auVar55 = vfmsub231ps_fma(auVar64,auVar61,auVar62);
            auVar17._4_4_ = auVar62._4_4_ * auVar19._4_4_;
            auVar17._0_4_ = auVar62._0_4_ * auVar19._0_4_;
            auVar17._8_4_ = auVar62._8_4_ * auVar19._8_4_;
            auVar17._12_4_ = auVar62._12_4_ * auVar19._12_4_;
            auVar17._16_4_ = auVar62._16_4_ * auVar19._16_4_;
            auVar17._20_4_ = auVar62._20_4_ * auVar19._20_4_;
            auVar17._24_4_ = auVar62._24_4_ * auVar19._24_4_;
            auVar17._28_4_ = auVar62._28_4_;
            auVar88 = vfmsub231ps_fma(auVar17,auVar18,auVar98);
            fStack_105c = local_1060;
            fStack_1058 = local_1060;
            fStack_1054 = local_1060;
            fStack_1050 = local_1060;
            fStack_104c = local_1060;
            fStack_1048 = local_1060;
            fStack_1044 = local_1060;
            auVar63._0_4_ = local_1060 * auVar88._0_4_;
            auVar63._4_4_ = local_1060 * auVar88._4_4_;
            auVar63._8_4_ = local_1060 * auVar88._8_4_;
            auVar63._12_4_ = local_1060 * auVar88._12_4_;
            auVar63._16_4_ = local_1060 * 0.0;
            auVar63._20_4_ = local_1060 * 0.0;
            auVar63._24_4_ = local_1060 * 0.0;
            auVar63._28_4_ = 0;
            auVar55 = vfmadd231ps_fma(auVar63,local_14c0,ZEXT1632(auVar55));
            auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),local_1440,ZEXT1632(auVar57));
            local_1300 = auVar94._0_4_;
            fStack_12fc = auVar94._4_4_;
            fStack_12f8 = auVar94._8_4_;
            fStack_12f4 = auVar94._12_4_;
            local_12e0 = ZEXT1632(CONCAT412(auVar55._12_4_ + local_1320._12_4_ + fStack_12f4,
                                            CONCAT48(auVar55._8_4_ + local_1320._8_4_ + fStack_12f8,
                                                     CONCAT44(auVar55._4_4_ +
                                                              local_1320._4_4_ + fStack_12fc,
                                                              auVar55._0_4_ +
                                                              local_1320._0_4_ + local_1300))));
            auVar59._8_4_ = 0x7fffffff;
            auVar59._0_8_ = 0x7fffffff7fffffff;
            auVar59._12_4_ = 0x7fffffff;
            auVar59._16_4_ = 0x7fffffff;
            auVar59._20_4_ = 0x7fffffff;
            auVar59._24_4_ = 0x7fffffff;
            auVar59._28_4_ = 0x7fffffff;
            local_1100 = ZEXT1632(local_1320);
            auVar52 = vminps_avx(local_1100,ZEXT1632(auVar94));
            auVar52 = vminps_avx(auVar52,ZEXT1632(auVar55));
            local_1120 = vandps_avx(local_12e0,auVar59);
            fVar99 = local_1120._0_4_ * 1.1920929e-07;
            fVar104 = local_1120._4_4_ * 1.1920929e-07;
            auVar28._4_4_ = fVar104;
            auVar28._0_4_ = fVar99;
            fVar105 = local_1120._8_4_ * 1.1920929e-07;
            auVar28._8_4_ = fVar105;
            fVar106 = local_1120._12_4_ * 1.1920929e-07;
            auVar28._12_4_ = fVar106;
            fVar107 = local_1120._16_4_ * 1.1920929e-07;
            auVar28._16_4_ = fVar107;
            fVar108 = local_1120._20_4_ * 1.1920929e-07;
            auVar28._20_4_ = fVar108;
            fVar109 = local_1120._24_4_ * 1.1920929e-07;
            auVar28._24_4_ = fVar109;
            auVar28._28_4_ = 0x34000000;
            auVar114._0_8_ = CONCAT44(fVar104,fVar99) ^ 0x8000000080000000;
            auVar114._8_4_ = -fVar105;
            auVar114._12_4_ = -fVar106;
            auVar114._16_4_ = -fVar107;
            auVar114._20_4_ = -fVar108;
            auVar114._24_4_ = -fVar109;
            auVar114._28_4_ = 0xb4000000;
            auVar52 = vcmpps_avx(auVar52,auVar114,5);
            local_10e0 = ZEXT1632(auVar94);
            auVar73 = vmaxps_avx(local_1100,ZEXT1632(auVar94));
            auVar73 = vmaxps_avx(auVar73,ZEXT1632(auVar55));
            auVar73 = vcmpps_avx(auVar73,auVar28,2);
            auVar73 = vorps_avx(auVar52,auVar73);
            if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar73 >> 0x7f,0) != '\0') ||
                  (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar73 >> 0xbf,0) != '\0') ||
                (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar73[0x1f] < '\0') {
              auVar29._4_4_ = fVar127 * local_1020._4_4_;
              auVar29._0_4_ = fVar124 * local_1020._0_4_;
              auVar29._8_4_ = fVar128 * local_1020._8_4_;
              auVar29._12_4_ = fVar129 * local_1020._12_4_;
              auVar29._16_4_ = fVar130 * local_1020._16_4_;
              auVar29._20_4_ = fVar131 * local_1020._20_4_;
              auVar29._24_4_ = fVar132 * local_1020._24_4_;
              auVar29._28_4_ = auVar52._28_4_;
              auVar30._4_4_ = fVar138 * local_1400._4_4_;
              auVar30._0_4_ = fVar136 * local_1400._0_4_;
              auVar30._8_4_ = fVar139 * local_1400._8_4_;
              auVar30._12_4_ = fVar140 * local_1400._12_4_;
              auVar30._16_4_ = fVar141 * local_1400._16_4_;
              auVar30._20_4_ = fVar142 * local_1400._20_4_;
              auVar30._24_4_ = fVar143 * local_1400._24_4_;
              auVar30._28_4_ = fVar144;
              auVar94 = vfmsub213ps_fma(local_1400,local_10a0,auVar29);
              auVar31._4_4_ = fVar66 * auVar19._4_4_;
              auVar31._0_4_ = fVar65 * auVar19._0_4_;
              auVar31._8_4_ = fVar67 * auVar19._8_4_;
              auVar31._12_4_ = fVar68 * auVar19._12_4_;
              auVar31._16_4_ = fVar79 * auVar19._16_4_;
              auVar31._20_4_ = fVar80 * auVar19._20_4_;
              auVar31._24_4_ = fVar81 * auVar19._24_4_;
              auVar31._28_4_ = 0x34000000;
              local_1400._8_4_ = 0x80000000;
              local_1400._0_8_ = 0x8000000080000000;
              local_1400._12_4_ = 0x80000000;
              local_1400._16_4_ = 0x80000000;
              local_1400._20_4_ = 0x80000000;
              local_1400._24_4_ = 0x80000000;
              local_1400._28_4_ = 0x80000000;
              auVar120._0_4_ = fVar136 * auVar61._0_4_;
              auVar120._4_4_ = fVar138 * auVar61._4_4_;
              auVar120._8_4_ = fVar139 * auVar61._8_4_;
              auVar120._12_4_ = fVar140 * auVar61._12_4_;
              auVar120._16_4_ = fVar141 * auVar61._16_4_;
              auVar120._20_4_ = fVar142 * auVar61._20_4_;
              auVar120._24_4_ = fVar143 * auVar61._24_4_;
              auVar120._28_4_ = 0;
              auVar55 = vfmsub213ps_fma(auVar61,local_1080,auVar31);
              auVar52 = vandps_avx(auVar29,auVar59);
              auVar64 = vandps_avx(auVar31,auVar59);
              auVar52 = vcmpps_avx(auVar52,auVar64,1);
              local_12c0 = vblendvps_avx(ZEXT1632(auVar55),ZEXT1632(auVar94),auVar52);
              auVar133._0_4_ = fVar124 * auVar18._0_4_;
              auVar133._4_4_ = fVar127 * auVar18._4_4_;
              auVar133._8_4_ = fVar128 * auVar18._8_4_;
              auVar133._12_4_ = fVar129 * auVar18._12_4_;
              auVar133._16_4_ = fVar130 * auVar18._16_4_;
              auVar133._20_4_ = fVar131 * auVar18._20_4_;
              auVar133._24_4_ = fVar132 * auVar18._24_4_;
              auVar133._28_4_ = 0;
              auVar94 = vfmsub213ps_fma(auVar18,local_10a0,auVar120);
              auVar32._4_4_ = local_1040._4_4_ * fVar66;
              auVar32._0_4_ = local_1040._0_4_ * fVar65;
              auVar32._8_4_ = local_1040._8_4_ * fVar67;
              auVar32._12_4_ = local_1040._12_4_ * fVar68;
              auVar32._16_4_ = local_1040._16_4_ * fVar79;
              auVar32._20_4_ = local_1040._20_4_ * fVar80;
              auVar32._24_4_ = local_1040._24_4_ * fVar81;
              auVar32._28_4_ = auVar64._28_4_;
              auVar55 = vfmsub213ps_fma(local_1020,local_10c0,auVar32);
              auVar52 = vandps_avx(auVar32,auVar59);
              auVar64 = vandps_avx(auVar120,auVar59);
              auVar52 = vcmpps_avx(auVar52,auVar64,1);
              local_12a0 = vblendvps_avx(ZEXT1632(auVar94),ZEXT1632(auVar55),auVar52);
              auVar94 = vfmsub213ps_fma(local_1040,local_1080,auVar30);
              auVar55 = vfmsub213ps_fma(auVar19,local_10c0,auVar133);
              auVar52 = vandps_avx(auVar30,auVar59);
              auVar64 = vandps_avx(auVar133,auVar59);
              auVar52 = vcmpps_avx(auVar52,auVar64,1);
              local_1280 = vblendvps_avx(ZEXT1632(auVar55),ZEXT1632(auVar94),auVar52);
              auVar94 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
              fVar68 = local_1280._0_4_;
              fVar79 = local_1280._4_4_;
              auVar19._4_4_ = fVar79 * local_1060;
              auVar19._0_4_ = fVar68 * local_1060;
              fVar80 = local_1280._8_4_;
              auVar19._8_4_ = fVar80 * local_1060;
              fVar81 = local_1280._12_4_;
              auVar19._12_4_ = fVar81 * local_1060;
              fVar104 = local_1280._16_4_;
              auVar19._16_4_ = fVar104 * local_1060;
              fVar105 = local_1280._20_4_;
              auVar19._20_4_ = fVar105 * local_1060;
              fVar106 = local_1280._24_4_;
              auVar19._24_4_ = fVar106 * local_1060;
              auVar19._28_4_ = fVar144;
              auVar55 = vfmadd213ps_fma(local_14c0,local_12a0,auVar19);
              auVar55 = vfmadd213ps_fma(local_1440,local_12c0,ZEXT1632(auVar55));
              fVar99 = auVar55._0_4_ + auVar55._0_4_;
              fVar65 = auVar55._4_4_ + auVar55._4_4_;
              fVar66 = auVar55._8_4_ + auVar55._8_4_;
              fVar67 = auVar55._12_4_ + auVar55._12_4_;
              auVar64 = ZEXT1632(CONCAT412(fVar67,CONCAT48(fVar66,CONCAT44(fVar65,fVar99))));
              auVar115._0_4_ = fVar68 * fVar87;
              auVar115._4_4_ = fVar79 * fVar11;
              auVar115._8_4_ = fVar80 * fVar12;
              auVar115._12_4_ = fVar81 * fVar13;
              auVar115._16_4_ = fVar104 * fVar14;
              auVar115._20_4_ = fVar105 * fVar15;
              auVar115._24_4_ = fVar106 * fVar16;
              auVar115._28_4_ = 0;
              auVar55 = vfmadd213ps_fma(local_fe0,local_12a0,auVar115);
              auVar57 = vfmadd213ps_fma(local_13e0,local_12c0,ZEXT1632(auVar55));
              auVar52 = vrcpps_avx(auVar64);
              auVar134._8_4_ = 0x3f800000;
              auVar134._0_8_ = &DAT_3f8000003f800000;
              auVar134._12_4_ = 0x3f800000;
              auVar134._16_4_ = 0x3f800000;
              auVar134._20_4_ = 0x3f800000;
              auVar134._24_4_ = 0x3f800000;
              auVar134._28_4_ = 0x3f800000;
              auVar55 = vfnmadd213ps_fma(auVar52,auVar64,auVar134);
              auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar52,auVar52);
              local_14c0._28_4_ = 0x3f800000;
              local_14c0._0_28_ =
                   ZEXT1628(CONCAT412((auVar57._12_4_ + auVar57._12_4_) * auVar55._12_4_,
                                      CONCAT48((auVar57._8_4_ + auVar57._8_4_) * auVar55._8_4_,
                                               CONCAT44((auVar57._4_4_ + auVar57._4_4_) *
                                                        auVar55._4_4_,
                                                        (auVar57._0_4_ + auVar57._0_4_) *
                                                        auVar55._0_4_))));
              uVar36 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar116._4_4_ = uVar36;
              auVar116._0_4_ = uVar36;
              auVar116._8_4_ = uVar36;
              auVar116._12_4_ = uVar36;
              auVar116._16_4_ = uVar36;
              auVar116._20_4_ = uVar36;
              auVar116._24_4_ = uVar36;
              auVar116._28_4_ = uVar36;
              auVar52 = vcmpps_avx(auVar116,local_14c0,2);
              fVar87 = (ray->super_RayK<1>).tfar;
              auVar121._4_4_ = fVar87;
              auVar121._0_4_ = fVar87;
              auVar121._8_4_ = fVar87;
              auVar121._12_4_ = fVar87;
              auVar121._16_4_ = fVar87;
              auVar121._20_4_ = fVar87;
              auVar121._24_4_ = fVar87;
              auVar121._28_4_ = fVar87;
              auVar73 = vcmpps_avx(local_14c0,auVar121,2);
              auVar52 = vandps_avx(auVar52,auVar73);
              auVar122._0_8_ = CONCAT44(fVar65,fVar99) ^ 0x8000000080000000;
              auVar122._8_4_ = -fVar66;
              auVar122._12_4_ = -fVar67;
              auVar122._16_4_ = 0x80000000;
              auVar122._20_4_ = 0x80000000;
              auVar122._24_4_ = 0x80000000;
              auVar122._28_4_ = 0x80000000;
              auVar73 = vcmpps_avx(auVar122,auVar64,4);
              auVar52 = vandps_avx(auVar52,auVar73);
              auVar55 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
              auVar94 = vpand_avx(auVar55,auVar94);
              local_1260 = vpmovsxwd_avx2(auVar94);
              if ((((((((local_1260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1260 >> 0x7f,0) != '\0') ||
                    (local_1260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1260 >> 0xbf,0) != '\0') ||
                  (local_1260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1260[0x1f] < '\0') {
                uStack_1310 = 0;
                uStack_130c = 0;
                uStack_1308 = 0;
                uStack_1304 = 0;
                uStack_12f0 = 0;
                uStack_12ec = 0;
                uStack_12e8 = 0;
                uStack_12e4 = 0;
                local_1200 = local_14c0;
                local_1180 = local_1140;
                auVar52 = vrcpps_avx(local_12e0);
                local_1420 = local_1260;
                auVar125._8_4_ = 0x3f800000;
                auVar125._0_8_ = &DAT_3f8000003f800000;
                auVar125._12_4_ = 0x3f800000;
                auVar125._16_4_ = 0x3f800000;
                auVar125._20_4_ = 0x3f800000;
                auVar125._24_4_ = 0x3f800000;
                auVar125._28_4_ = 0x3f800000;
                auVar55 = vfnmadd213ps_fma(local_12e0,auVar52,auVar125);
                auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar52,auVar52);
                auVar117._8_4_ = 0x219392ef;
                auVar117._0_8_ = 0x219392ef219392ef;
                auVar117._12_4_ = 0x219392ef;
                auVar117._16_4_ = 0x219392ef;
                auVar117._20_4_ = 0x219392ef;
                auVar117._24_4_ = 0x219392ef;
                auVar117._28_4_ = 0x219392ef;
                auVar52 = vcmpps_avx(local_1120,auVar117,5);
                auVar52 = vandps_avx(auVar52,ZEXT1632(auVar55));
                auVar33._4_4_ = local_1320._4_4_ * auVar52._4_4_;
                auVar33._0_4_ = local_1320._0_4_ * auVar52._0_4_;
                auVar33._8_4_ = local_1320._8_4_ * auVar52._8_4_;
                auVar33._12_4_ = local_1320._12_4_ * auVar52._12_4_;
                auVar33._16_4_ = auVar52._16_4_ * 0.0;
                auVar33._20_4_ = auVar52._20_4_ * 0.0;
                auVar33._24_4_ = auVar52._24_4_ * 0.0;
                auVar33._28_4_ = 0;
                auVar73 = vminps_avx(auVar33,auVar125);
                auVar34._4_4_ = fStack_12fc * auVar52._4_4_;
                auVar34._0_4_ = local_1300 * auVar52._0_4_;
                auVar34._8_4_ = fStack_12f8 * auVar52._8_4_;
                auVar34._12_4_ = fStack_12f4 * auVar52._12_4_;
                auVar34._16_4_ = auVar52._16_4_ * 0.0;
                auVar34._20_4_ = auVar52._20_4_ * 0.0;
                auVar34._24_4_ = auVar52._24_4_ * 0.0;
                auVar34._28_4_ = 0;
                auVar52 = vminps_avx(auVar34,auVar125);
                auVar64 = vsubps_avx(auVar125,auVar73);
                local_1220 = vblendvps_avx(auVar52,auVar64,local_1140);
                auVar52 = vsubps_avx(auVar125,auVar52);
                local_1240 = vblendvps_avx(auVar73,auVar52,local_1140);
                fVar87 = local_1160._0_4_;
                fVar11 = local_1160._4_4_;
                fVar12 = local_1160._8_4_;
                fVar13 = local_1160._12_4_;
                fVar14 = local_1160._16_4_;
                fVar15 = local_1160._20_4_;
                fVar16 = local_1160._24_4_;
                local_11e0[0] = local_12c0._0_4_ * fVar87;
                local_11e0[1] = local_12c0._4_4_ * fVar11;
                local_11e0[2] = local_12c0._8_4_ * fVar12;
                local_11e0[3] = local_12c0._12_4_ * fVar13;
                fStack_11d0 = local_12c0._16_4_ * fVar14;
                fStack_11cc = local_12c0._20_4_ * fVar15;
                fStack_11c8 = local_12c0._24_4_ * fVar16;
                uStack_11c4 = local_1240._28_4_;
                local_11c0[0] = fVar87 * local_12a0._0_4_;
                local_11c0[1] = fVar11 * local_12a0._4_4_;
                local_11c0[2] = fVar12 * local_12a0._8_4_;
                local_11c0[3] = fVar13 * local_12a0._12_4_;
                fStack_11b0 = fVar14 * local_12a0._16_4_;
                fStack_11ac = fVar15 * local_12a0._20_4_;
                fStack_11a8 = fVar16 * local_12a0._24_4_;
                uStack_11a4 = auVar52._28_4_;
                local_11a0[0] = fVar87 * fVar68;
                local_11a0[1] = fVar11 * fVar79;
                local_11a0[2] = fVar12 * fVar80;
                local_11a0[3] = fVar13 * fVar81;
                fStack_1190 = fVar14 * fVar104;
                fStack_118c = fVar15 * fVar105;
                fStack_1188 = fVar16 * fVar106;
                uStack_1184 = local_1280._28_4_;
                auVar52 = vpmovzxwd_avx2(auVar94);
                auVar52 = vpslld_avx2(auVar52,0x1f);
                auVar78._8_4_ = 0x7f800000;
                auVar78._0_8_ = 0x7f8000007f800000;
                auVar78._12_4_ = 0x7f800000;
                auVar78._16_4_ = 0x7f800000;
                auVar78._20_4_ = 0x7f800000;
                auVar78._24_4_ = 0x7f800000;
                auVar78._28_4_ = 0x7f800000;
                auVar52 = vblendvps_avx(auVar78,local_14c0,auVar52);
                auVar73 = vshufps_avx(auVar52,auVar52,0xb1);
                auVar73 = vminps_avx(auVar52,auVar73);
                auVar64 = vshufpd_avx(auVar73,auVar73,5);
                auVar73 = vminps_avx(auVar73,auVar64);
                auVar64 = vpermpd_avx2(auVar73,0x4e);
                auVar73 = vminps_avx(auVar73,auVar64);
                auVar52 = vcmpps_avx(auVar52,auVar73,0);
                auVar55 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
                auVar94 = vpand_avx(auVar55,auVar94);
                auVar52 = vpmovzxwd_avx2(auVar94);
                auVar52 = vpslld_avx2(auVar52,0x1f);
                if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar52 >> 0x7f,0) == '\0') &&
                      (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar52 >> 0xbf,0) == '\0') &&
                    (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar52[0x1f]) {
                  auVar52 = local_1260;
                }
                uVar38 = vmovmskps_avx(auVar52);
                uVar39 = 0;
                for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x80000000) {
                  uVar39 = uVar39 + 1;
                }
                local_14f8 = pSVar47;
                do {
                  uVar48 = (ulong)uVar39;
                  uVar39 = *(uint *)((long)&local_fc0 + uVar48 * 4);
                  pGVar8 = (pSVar47->geometries).items[uVar39].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1420 + uVar48 * 4) = 0;
                  }
                  else {
                    pRVar9 = context->args;
                    if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar87 = *(float *)(local_1240 + uVar48 * 4);
                      fVar11 = *(float *)(local_1220 + uVar48 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1200 + uVar48 * 4);
                      (ray->Ng).field_0.field_0.x = local_11e0[uVar48];
                      (ray->Ng).field_0.field_0.y = local_11c0[uVar48];
                      (ray->Ng).field_0.field_0.z = local_11a0[uVar48];
                      ray->u = fVar87;
                      ray->v = fVar11;
                      ray->primID = *(uint *)((long)&local_1340 + uVar48 * 4);
                      ray->geomID = uVar39;
                      pRVar10 = context->user;
                      ray->instID[0] = pRVar10->instID[0];
                      ray->instPrimID[0] = pRVar10->instPrimID[0];
                      unaff_R13 = local_1500;
                      break;
                    }
                    local_14f0.context = context->user;
                    local_1470 = local_11e0[uVar48];
                    local_146c = local_11c0[uVar48];
                    local_1468 = local_11a0[uVar48];
                    local_1464 = *(undefined4 *)(local_1240 + uVar48 * 4);
                    local_1460 = *(undefined4 *)(local_1220 + uVar48 * 4);
                    local_145c = *(undefined4 *)((long)&local_1340 + uVar48 * 4);
                    local_1458 = uVar39;
                    local_1454 = (local_14f0.context)->instID[0];
                    local_1450 = (local_14f0.context)->instPrimID[0];
                    local_1440._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1200 + uVar48 * 4);
                    local_1504 = -1;
                    local_14f0.valid = &local_1504;
                    local_14f0.geometryUserPtr = pGVar8->userPtr;
                    local_14f0.ray = (RTCRayN *)ray;
                    local_14f0.hit = (RTCHitN *)&local_1470;
                    local_14f0.N = 1;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019f33d6:
                      if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar9->filter)(&local_14f0);
                        }
                        if (*local_14f0.valid == 0) goto LAB_019f34e5;
                      }
                      (((Vec3f *)((long)local_14f0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_14f0.hit;
                      (((Vec3f *)((long)local_14f0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_14f0.hit + 4);
                      (((Vec3f *)((long)local_14f0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_14f0.hit + 8);
                      *(float *)((long)local_14f0.ray + 0x3c) = *(float *)(local_14f0.hit + 0xc);
                      *(float *)((long)local_14f0.ray + 0x40) = *(float *)(local_14f0.hit + 0x10);
                      *(float *)((long)local_14f0.ray + 0x44) = *(float *)(local_14f0.hit + 0x14);
                      *(float *)((long)local_14f0.ray + 0x48) = *(float *)(local_14f0.hit + 0x18);
                      *(float *)((long)local_14f0.ray + 0x4c) = *(float *)(local_14f0.hit + 0x1c);
                      *(float *)((long)local_14f0.ray + 0x50) = *(float *)(local_14f0.hit + 0x20);
                    }
                    else {
                      local_13e0._0_8_ = lVar44;
                      (*pGVar8->intersectionFilterN)(&local_14f0);
                      lVar44 = local_13e0._0_8_;
                      if (*local_14f0.valid != 0) goto LAB_019f33d6;
LAB_019f34e5:
                      (ray->super_RayK<1>).tfar = (float)local_1440._0_4_;
                    }
                    *(undefined4 *)(local_1420 + uVar48 * 4) = 0;
                    fVar87 = (ray->super_RayK<1>).tfar;
                    auVar53._4_4_ = fVar87;
                    auVar53._0_4_ = fVar87;
                    auVar53._8_4_ = fVar87;
                    auVar53._12_4_ = fVar87;
                    auVar53._16_4_ = fVar87;
                    auVar53._20_4_ = fVar87;
                    auVar53._24_4_ = fVar87;
                    auVar53._28_4_ = fVar87;
                    auVar52 = vcmpps_avx(local_14c0,auVar53,2);
                    local_1420 = vandps_avx(auVar52,local_1420);
                    unaff_R13 = local_1500;
                  }
                  pSVar47 = local_14f8;
                  if ((((((((local_1420 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1420 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1420 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1420 >> 0x7f,0) == '\0') &&
                        (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1420 >> 0xbf,0) == '\0') &&
                      (local_1420 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1420[0x1f]) break;
                  BVHNIntersector1<4,1048576,false,embree::avx2::ArrayIntersector1<embree::avx2::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_14f0);
                  uVar39 = (uint)local_14f0.valid;
                } while( true );
              }
            }
            lVar44 = lVar44 + 1;
          } while (lVar44 != local_1490);
        }
        fVar87 = (ray->super_RayK<1>).tfar;
        auVar54 = ZEXT1664(CONCAT412(fVar87,CONCAT48(fVar87,CONCAT44(fVar87,fVar87))));
        auVar123 = ZEXT1664(local_1350);
        auVar126 = ZEXT1664(local_1360);
        auVar135 = ZEXT1664(local_1370);
        auVar137 = ZEXT1664(local_1380);
        auVar146 = ZEXT1664(local_1390);
        auVar147 = ZEXT1664(local_13a0);
        auVar149 = ZEXT1664(local_13b0);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }